

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O1

void hyperplane_internal(int ndims,int *dims,int *original_grid_dimensions,int *grid_points,
                        int n_nodes,int n_processes_p_node,int my_rank,int *new_rank_coords,
                        int my_partition,double *angle_values,int grid_size,int *dimension_order,
                        int partition_id)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int local_64;
  
  local_64 = partition_id;
LAB_00132a30:
  hyperplane_dimension_order(angle_values,dims,ndims,dimension_order);
  if (n_processes_p_node * 2 < grid_size) {
    if (0 < ndims) {
      uVar7 = 0;
      do {
        iVar1 = dimension_order[uVar7];
        iVar8 = dims[iVar1];
        if (iVar8 != 1) {
          if (n_processes_p_node == 0) {
            __assert_fail("n_processes_p_node != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/reordering_algorithms/hyperplane/hyperplane.cpp"
                          ,0x8e,
                          "void hyperplane_internal(const int, int *, const int *, int *, const int, const int, const int, int *, const int, const double *, int, int *, int)"
                         );
          }
          if (iVar8 == 0) {
            __assert_fail("dims[best_dimension_index] != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/reordering_algorithms/hyperplane/hyperplane.cpp"
                          ,0x8f,
                          "void hyperplane_internal(const int, int *, const int *, int *, const int, const int, const int, int *, const int, const double *, int, int *, int)"
                         );
          }
          iVar3 = grid_size / iVar8;
          iVar9 = iVar8 / 2;
          iVar8 = iVar8 - iVar9;
          iVar10 = iVar9;
          if ((iVar9 * iVar3) % n_processes_p_node != 0) {
            iVar5 = iVar3 * iVar8;
            iVar6 = (iVar9 + -1) * iVar3;
            do {
              if ((iVar10 < 2) || (iVar5 % n_processes_p_node == 0)) break;
              iVar10 = iVar10 + -1;
              iVar8 = iVar8 + 1;
              iVar4 = iVar6 % n_processes_p_node;
              iVar5 = iVar5 + iVar3;
              iVar6 = iVar6 - iVar3;
            } while (iVar4 != 0);
          }
          uVar2 = iVar1 * 2;
          iVar5 = grid_points[(int)uVar2];
          iVar6 = iVar8;
          if (iVar9 + iVar5 < original_grid_dimensions[iVar1] / 2) {
            iVar6 = iVar10;
          }
          iVar4 = iVar6 * iVar3;
          if (iVar4 % n_processes_p_node == 0) {
            if (iVar9 + iVar5 < original_grid_dimensions[iVar1] / 2) {
              iVar10 = iVar8;
            }
            if ((iVar3 * iVar10) % n_processes_p_node == 0) goto LAB_00132b57;
          }
        }
        uVar7 = uVar7 + 1;
        if (uVar7 == (uint)ndims) {
          return;
        }
      } while( true );
    }
  }
  else {
    base_case_new_coord_calculation
              (ndims,my_rank,local_64,n_processes_p_node,grid_points,new_rank_coords,dimension_order
              );
  }
  return;
LAB_00132b57:
  iVar8 = iVar4 / n_processes_p_node + local_64;
  if (my_partition < iVar8) {
    grid_points[(int)(uVar2 | 1)] = iVar6 + iVar5 + -1;
    dims[iVar1] = iVar6;
    grid_size = iVar4;
  }
  else {
    grid_points[(int)uVar2] = iVar6 + iVar5;
    dims[iVar1] = iVar10;
    grid_size = iVar3 * iVar10;
    local_64 = iVar8;
  }
  goto LAB_00132a30;
}

Assistant:

void hyperplane_internal(const int ndims,
			 int dims[],
			 const int original_grid_dimensions[],
			 int grid_points[],
			 const int n_nodes,
			 const int n_processes_p_node,
			 const int my_rank,
			 int new_rank_coords[],
			 const int my_partition,
			 const double angle_values[],
			 int grid_size,
			 int dimension_order[],
			 int partition_id) {
  hyperplane_dimension_order(angle_values, dims, ndims, dimension_order);
  //Entering base case is either having two
  //nodes or one and then fill it up
  if (grid_size <= 2 * n_processes_p_node) {
	base_case_new_coord_calculation(ndims,
					my_rank,
					partition_id,
					n_processes_p_node,
					grid_points,
					new_rank_coords,
					dimension_order);

	return;
  }

  //Find the split and recurse
  //O ( ndims)
  int best_dimension_index;
  for (int i{0}; i < ndims; i++) {
	best_dimension_index = dimension_order[i];
	if (dims[best_dimension_index] == 1) {
	  continue;
	}

	assert(n_processes_p_node != 0);
	assert(dims[best_dimension_index] != 0);
	//Try to split s.t both sides are a multiple of the number of processes on a node
	int subvolume = grid_size / dims[best_dimension_index];

	//Initial positioning of hyperplane
	int split_lhs, split_rhs;
	split_lhs = dims[best_dimension_index] / 2;
	split_rhs = dims[best_dimension_index] - split_lhs;

	//Try to find split along dimension with balanced sizes
	//O( dims[best_dimension_index] )
	while ((subvolume * split_lhs) % n_processes_p_node != 0 &&
		(subvolume * split_rhs) % n_processes_p_node != 0 && split_lhs > 1) {
	  split_lhs -= 1;
	  split_rhs += 1;
	}

	//swap the two variables if the leftside of the subgrid is closer to right boundary
	if (grid_points[2 * best_dimension_index] + dims[best_dimension_index] / 2 >=
		original_grid_dimensions[best_dimension_index] / 2) {
	  int tmp = split_rhs;
	  split_rhs = split_lhs;
	  split_lhs = tmp;
	}

	//If partition was found, recurse
	if (subvolume * split_lhs % n_processes_p_node == 0 &&
		subvolume * split_rhs % n_processes_p_node == 0) {
	  //Adjust and enter the recursion
	  int remaining_partitions = subvolume * split_lhs / n_processes_p_node;

	  //case for the left hand side
	  if (my_partition < partition_id + remaining_partitions) {
		//adjust the grid points left hand side
		grid_points[2 * best_dimension_index + 1] = grid_points[2 * best_dimension_index] + split_lhs - 1;

		//adjust the dimensions left hand side
		dims[best_dimension_index] = split_lhs;

		hyperplane_internal(ndims, dims,
					original_grid_dimensions,
					grid_points,
					n_nodes,
					n_processes_p_node,
					my_rank,
					new_rank_coords,
					my_partition,
					angle_values,
					subvolume * split_lhs,
					dimension_order,
					partition_id);
	  }
		//case for the right hand side
	  else {
		//adjust the grid points rhs
		grid_points[2 * best_dimension_index] = grid_points[2 * best_dimension_index] + split_lhs;
		//adjust the dimesion size rhs
		dims[best_dimension_index] = split_rhs;

		hyperplane_internal(ndims, dims,
				original_grid_dimensions,
				grid_points, n_nodes,
				n_processes_p_node,
				my_rank,
				new_rank_coords,
				my_partition,
				angle_values,
				subvolume * split_rhs,
				dimension_order,
				partition_id + remaining_partitions);
	  }
	  //Exit for loop!
	  break;
	}
  }
}